

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text-buffer.cc
# Opt level: O0

bool __thiscall TextBuffer::deserialize_changes(TextBuffer *this,Deserializer *deserializer)

{
  uint uVar1;
  Layer *this_00;
  Patch local_78;
  Point local_34 [2];
  Deserializer *local_20;
  Deserializer *deserializer_local;
  TextBuffer *this_local;
  
  if ((this->top_layer == this->base_layer) && (this->base_layer->previous_layer == (Layer *)0x0)) {
    local_20 = deserializer;
    deserializer_local = (Deserializer *)this;
    this_00 = (Layer *)operator_new(0xa0);
    Layer::Layer(this_00,this->base_layer);
    this->top_layer = this_00;
    uVar1 = Deserializer::read<unsigned_int>(local_20);
    this->top_layer->size_ = uVar1;
    Point::Point(local_34,local_20);
    this->top_layer->extent_ = local_34[0];
    Patch::Patch(&local_78,local_20);
    Patch::operator=(&this->top_layer->patch,&local_78);
    Patch::~Patch(&local_78);
    this_local._7_1_ = true;
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool TextBuffer::deserialize_changes(Deserializer &deserializer) {
  if (top_layer != base_layer || base_layer->previous_layer) return false;
  top_layer = new Layer(base_layer);
  top_layer->size_ = deserializer.read<uint32_t>();
  top_layer->extent_ = Point(deserializer);
  top_layer->patch = Patch(deserializer);
  return true;
}